

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpp_message.cc
# Opt level: O0

bool google::protobuf::compiler::cpp::anon_unknown_0::EmitFieldNonDefaultCondition
               (Printer *printer,string *prefix,FieldDescriptor *field)

{
  FieldDescriptor *pFVar1;
  string *psVar2;
  bool bVar3;
  CppType CVar4;
  OneofDescriptor *pOVar5;
  FieldDescriptor *field_00;
  FieldDescriptor *field_01;
  FieldDescriptor *field_02;
  string local_b8;
  string local_98;
  string local_78;
  string local_48;
  FieldDescriptor *local_28;
  FieldDescriptor *field_local;
  string *prefix_local;
  Printer *printer_local;
  
  local_28 = field;
  field_local = (FieldDescriptor *)prefix;
  prefix_local = (string *)printer;
  bVar3 = FieldDescriptor::is_repeated(field);
  if ((bVar3) ||
     (pOVar5 = FieldDescriptor::containing_oneof(local_28), pOVar5 != (OneofDescriptor *)0x0)) {
    pOVar5 = FieldDescriptor::containing_oneof(local_28);
    psVar2 = prefix_local;
    if (pOVar5 == (OneofDescriptor *)0x0) {
      printer_local._7_1_ = false;
    }
    else {
      FieldName_abi_cxx11_(&local_b8,(cpp *)local_28,field_02);
      io::Printer::Print((Printer *)psVar2,"if (has_$name$()) {\n","name",&local_b8);
      std::__cxx11::string::~string((string *)&local_b8);
      io::Printer::Indent((Printer *)prefix_local);
      printer_local._7_1_ = true;
    }
  }
  else {
    CVar4 = FieldDescriptor::cpp_type(local_28);
    psVar2 = prefix_local;
    pFVar1 = field_local;
    if (CVar4 == CPPTYPE_STRING) {
      FieldName_abi_cxx11_(&local_48,(cpp *)local_28,field_00);
      io::Printer::Print((Printer *)psVar2,"if ($prefix$$name$().size() > 0) {\n","prefix",
                         (string *)pFVar1,"name",&local_48);
      std::__cxx11::string::~string((string *)&local_48);
    }
    else {
      CVar4 = FieldDescriptor::cpp_type(local_28);
      psVar2 = prefix_local;
      pFVar1 = field_local;
      if (CVar4 == CPPTYPE_MESSAGE) {
        FieldName_abi_cxx11_(&local_78,(cpp *)local_28,field_01);
        io::Printer::Print((Printer *)psVar2,"if ($prefix$has_$name$()) {\n","prefix",
                           (string *)pFVar1,"name",&local_78);
        std::__cxx11::string::~string((string *)&local_78);
      }
      else {
        FieldName_abi_cxx11_(&local_98,(cpp *)local_28,field_01);
        io::Printer::Print((Printer *)psVar2,"if ($prefix$$name$() != 0) {\n","prefix",
                           (string *)pFVar1,"name",&local_98);
        std::__cxx11::string::~string((string *)&local_98);
      }
    }
    io::Printer::Indent((Printer *)prefix_local);
    printer_local._7_1_ = true;
  }
  return printer_local._7_1_;
}

Assistant:

bool EmitFieldNonDefaultCondition(io::Printer* printer,
                                  const string& prefix,
                                  const FieldDescriptor* field) {
  // Merge and serialize semantics: primitive fields are merged/serialized only
  // if non-zero (numeric) or non-empty (string).
  if (!field->is_repeated() && !field->containing_oneof()) {
    if (field->cpp_type() == FieldDescriptor::CPPTYPE_STRING) {
      printer->Print(
          "if ($prefix$$name$().size() > 0) {\n",
          "prefix", prefix,
          "name", FieldName(field));
    } else if (field->cpp_type() == FieldDescriptor::CPPTYPE_MESSAGE) {
      // Message fields still have has_$name$() methods.
      printer->Print(
          "if ($prefix$has_$name$()) {\n",
          "prefix", prefix,
          "name", FieldName(field));
    } else {
      printer->Print(
          "if ($prefix$$name$() != 0) {\n",
          "prefix", prefix,
          "name", FieldName(field));
    }
    printer->Indent();
    return true;
  } else if (field->containing_oneof()) {
    printer->Print(
        "if (has_$name$()) {\n",
        "name", FieldName(field));
    printer->Indent();
    return true;
  }
  return false;
}